

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O0

int strip_comments(char *line)

{
  char *pcVar1;
  char *in_RDI;
  char *cp2;
  char *cp1;
  
  while( true ) {
    while (strip_comments::in_comment != 0) {
      pcVar1 = strchr(in_RDI,0x7d);
      if (pcVar1 == (char *)0x0) {
        *in_RDI = '\0';
        return 0;
      }
      strcpy(in_RDI,pcVar1 + 1);
      strip_comments::in_comment = 0;
    }
    pcVar1 = strchr(in_RDI,0x2d);
    if ((pcVar1 != (char *)0x0) && (pcVar1[1] == '-')) break;
    pcVar1 = strchr(in_RDI,0x7b);
    if (pcVar1 == (char *)0x0) {
      return 0;
    }
    strip_comments::in_comment = 1;
    *pcVar1 = ' ';
  }
  *pcVar1 = '\0';
  return 0;
}

Assistant:

int
strip_comments(char *line)
{
    static int in_comment = 0;
    char *cp1, *cp2;

    cp1 = line;
    
    while (1)   /* traverse the entire string */
        {
        if (in_comment)
            {
            if ((cp2 = strchr(cp1, '}')) != NULL) /* comment ends */
                {
                strcpy(cp1, cp2 + 1);
                in_comment = 0;
                continue;
                }
            else 
                {
                *cp1 = '\0';
                break;
                }
            }
        else    /* not in_comment */
            {
            if ((cp2 = strchr(cp1, '-')) != NULL)
                {
                if (*(cp2 + 1) == '-')  /* found a '--' comment */
                    {
                    *cp2 = '\0';
                    break;
                    }
                }
            if ((cp2 = strchr(cp1, '{')) != NULL) /* comment starts */
                {
                in_comment = 1;
                *cp2 = ' ';
                continue;
                }
            else break;
            }
        }
    return(0);
}